

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildBr(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ByteCodeReader *this_00;
  RealCount *pRVar1;
  Instr *pIVar2;
  code *pcVar3;
  uint32 uVar4;
  bool bVar5;
  OpCode OVar6;
  uint uVar7;
  undefined4 *puVar8;
  OpLayoutBr *pOVar9;
  ulong uVar10;
  Type pSVar11;
  BranchInstr *branchInstr;
  ulong uVar12;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar13;
  LayoutSize local_34;
  uint32 local_30;
  LayoutSize layoutSize;
  uint targetOffset;
  uint32 offset_local;
  
  layoutSize = offset;
  bVar5 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c98,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar5) goto LAB_004ccff8;
    *puVar8 = 0;
  }
  this_00 = &this->m_jnReader;
  pOVar9 = Js::ByteCodeReader::Br(this_00);
  uVar7 = Js::ByteCodeReader::GetCurrentOffset(this_00);
  local_30 = (int)pOVar9->RelativeJumpOffset + uVar7;
  OVar6 = Js::ByteCodeReader::PeekOp(this_00,&local_34);
  if (OVar6 == BrLong) {
    ConsumeBranchIsland(this);
  }
  if (newOpcode == EndSwitch) {
    SwitchIRBuilder::EndSwitch(&this->m_switchBuilder,layoutSize,local_30);
    return;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,PerfHintPhase);
  if (((ushort)(newOpcode - TryCatch) < 2) && (bVar5)) {
    WritePerfHint(HasTryBlock,this->m_func,layoutSize);
  }
  uVar4 = local_30;
  if ((OVar6 == BrLong) && (uVar7 = Js::ByteCodeReader::GetCurrentOffset(this_00), uVar4 == uVar7))
  {
    if (this->m_offsetToInstructionCount <= layoutSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cb8,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar5) goto LAB_004ccff8;
      *puVar8 = 0;
    }
    pIVar2 = this->m_offsetToInstruction[layoutSize];
    if (pIVar2 == (Instr *)0x0) {
      this->m_offsetToInstruction[layoutSize] = (Instr *)&DAT_ffffffffffffffff;
      JsUtil::
      BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->longBranchMap,&layoutSize,&local_30);
      return;
    }
    if ((pIVar2->m_opcode != StatementBoundary) &&
       ((bVar5 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), !bVar5 ||
        (this->m_offsetToInstruction[layoutSize]->m_opcode != BailOnEqual)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cc9,
                         "(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual))"
                         ,
                         "m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual)"
                        );
      if (!bVar5) {
LAB_004ccff8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
  }
  if (newOpcode == TryFinally) {
    pSVar13 = this->handlerOffsetStack;
    if (pSVar13 ==
        (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) goto LAB_004ccfae;
    uVar10 = 0x10000000000;
  }
  else {
    if ((newOpcode != TryCatch) ||
       (pSVar13 = this->handlerOffsetStack,
       pSVar13 ==
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0)) goto LAB_004ccfae;
    uVar10 = 0x10100000000;
  }
  uVar12 = (ulong)local_30;
  pSVar11 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar13->allocator,0x366bee);
  pSVar11[1].next = (Type)(uVar12 | uVar10);
  pSVar11->next =
       (pSVar13->
       super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
       ).super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar13->
  super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
  pRVar1 = &(pSVar13->
            super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
            ).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
LAB_004ccfae:
  branchInstr = IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,this->m_func);
  AddBranchInstr(this,branchInstr,layoutSize,local_30);
  return;
}

Assistant:

void
IRBuilder::BuildBr(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::BranchInstr * branchInstr;
    const unaligned   Js::OpLayoutBr *branchInsn = m_jnReader.Br();
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
#ifdef BYTECODE_BRANCH_ISLAND
    bool isLongBranchIsland = (m_jnReader.PeekOp() == Js::OpCode::BrLong);
    if (isLongBranchIsland)
    {
        ConsumeBranchIsland();
    }
#endif

    if(newOpcode == Js::OpCode::EndSwitch)
    {
        m_switchBuilder.EndSwitch(offset, targetOffset);
        return;
    }
#ifdef PERF_HINT
    else if (PHASE_TRACE1(Js::PerfHintPhase) && (newOpcode == Js::OpCode::TryCatch || newOpcode == Js::OpCode::TryFinally) )
    {
        WritePerfHint(PerfHints::HasTryBlock, this->m_func, offset);
    }
#endif

#ifdef BYTECODE_BRANCH_ISLAND
    if (isLongBranchIsland && (targetOffset == (uint)m_jnReader.GetCurrentOffset()))
    {
        // Branch to next (probably after consume branch island), try to not emit the branch

        // Mark the jump around instruction as a virtual long branch as well so we can just
        // fall through instead of branch to exit
        Assert(offset < m_offsetToInstructionCount);
        if (m_offsetToInstruction[offset] == nullptr)
        {
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
            return;
        }

        // We may have already create an instruction on this offset as a statement boundary
        // or in the bailout at every byte code case.

        // The statement boundary case only happens if we have emitted the long branch island
        // after an existing no fall through instruction, but that instruction also happen to be
        // branch to next.  We will just generate an actual branch to next instruction.

        Assert(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary
            || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
            && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual));
    }
#endif

    if ((newOpcode == Js::OpCode::TryCatch) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, true));
    }
    else if ((newOpcode == Js::OpCode::TryFinally) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, false));
    }
    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}